

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O3

bool __thiscall ON_Sun::CImpl::SetLocalDateTime(CImpl *this,int year,int month,int day,double hours)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ON_XMLVariant local_118;
  
  uVar2 = 0x897;
  if (year < 0x897) {
    uVar2 = year;
  }
  uVar5 = 0x7b3;
  if (0x7b3 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  uVar2 = 0xc;
  if (month < 0xc) {
    uVar2 = month;
  }
  uVar4 = 1;
  if (1 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  if (((uVar5 & 3) != 0 || month != 2) ||
     ((sVar1 = (short)uVar5, iVar3 = 0x1d,
      (ushort)((ushort)(sVar1 * 0x5c29) >> 2 | sVar1 * 0x4000) < 0x290 &&
      (sVar1 != (short)((short)((uint)((uVar5 & 0xffff) >> 4) / 0x19) * 400))))) {
    iVar3 = ON_SunEngine::DaysInMonth::tab[uVar4];
  }
  if (iVar3 < day) {
    day = iVar3;
  }
  iVar3 = 1;
  if (1 < day) {
    iVar3 = day;
  }
  ::ON_XMLVariant::ON_XMLVariant(&local_118,(int)uVar5);
  ON_InternalXMLImpl::SetParameter
            (&this->super_ON_InternalXMLImpl,L"render-content-manager-document/settings/sun",L"year"
             ,&local_118);
  ::ON_XMLVariant::~ON_XMLVariant(&local_118);
  ::ON_XMLVariant::ON_XMLVariant(&local_118,(int)uVar4);
  ON_InternalXMLImpl::SetParameter
            (&this->super_ON_InternalXMLImpl,L"render-content-manager-document/settings/sun",
             L"month",&local_118);
  ::ON_XMLVariant::~ON_XMLVariant(&local_118);
  ::ON_XMLVariant::ON_XMLVariant(&local_118,iVar3);
  ON_InternalXMLImpl::SetParameter
            (&this->super_ON_InternalXMLImpl,L"render-content-manager-document/settings/sun",L"day",
             &local_118);
  ::ON_XMLVariant::~ON_XMLVariant(&local_118);
  ::ON_XMLVariant::ON_XMLVariant(&local_118,hours);
  ON_InternalXMLImpl::SetParameter
            (&this->super_ON_InternalXMLImpl,L"render-content-manager-document/settings/sun",L"time"
             ,&local_118);
  ::ON_XMLVariant::~ON_XMLVariant(&local_118);
  this->_calc_dirty = true;
  return true;
}

Assistant:

bool ON_Sun::CImpl::SetLocalDateTime(int year, int month, int day, double hours)
{
  year  = std::max(MinYear(), std::min(MaxYear(), year));
  month = std::max(1, std::min(12, month));
  day   = std::max(1, std::min(ON_SunEngine::DaysInMonth(month, year), day));

  const wchar_t* s = XMLPath_Sun();
  SetParameter(s, ON_RDK_SUN_DATE_YEAR,  year);
  SetParameter(s, ON_RDK_SUN_DATE_MONTH, month);
  SetParameter(s, ON_RDK_SUN_DATE_DAY,   day);
  SetParameter(s, ON_RDK_SUN_TIME_HOURS, hours);

  _calc_dirty = true;

  return true;
}